

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangularMatrix.h
# Opt level: O1

void __thiscall
Eigen::TriangularView<Eigen::Matrix<double,-1,-1,0,-1,-1>,10u>::
lazyAssign<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
          (TriangularView<Eigen::Matrix<double,_1,_1,0,_1,_1>,10u> *this,
          MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
          *other)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  plVar1 = *(long **)this;
  lVar2 = plVar1[1];
  if ((lVar2 == *(long *)other) && (lVar3 = plVar1[2], lVar3 == *(long *)(other + 8))) {
    if (0 < lVar3) {
      lVar4 = *plVar1;
      lVar5 = 0;
      do {
        lVar6 = lVar5;
        if (lVar2 < lVar5) {
          lVar6 = lVar2;
        }
        if (0 < lVar6) {
          lVar7 = 0;
          do {
            *(undefined8 *)(lVar4 + lVar7 * 8) = *(undefined8 *)(other + 0x10);
            lVar7 = lVar7 + 1;
          } while (lVar6 != lVar7);
        }
        lVar5 = lVar5 + 1;
        lVar4 = lVar4 + lVar2 * 8;
      } while (lVar5 != lVar3);
    }
    return;
  }
  __assert_fail("m_matrix.rows() == other.rows() && m_matrix.cols() == other.cols()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/TriangularMatrix.h"
                ,0x272,
                "void Eigen::TriangularView<Eigen::Matrix<double, -1, -1>, 10>::lazyAssign(const MatrixBase<OtherDerived> &) [MatrixType = Eigen::Matrix<double, -1, -1>, Mode = 10, OtherDerived = Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1>>]"
               );
}

Assistant:

void TriangularView<MatrixType, Mode>::lazyAssign(const MatrixBase<OtherDerived>& other)
{
  enum {
    unroll = MatrixType::SizeAtCompileTime != Dynamic
          && internal::traits<OtherDerived>::CoeffReadCost != Dynamic
          && MatrixType::SizeAtCompileTime*internal::traits<OtherDerived>::CoeffReadCost/2 <= EIGEN_UNROLLING_LIMIT
  };
  eigen_assert(m_matrix.rows() == other.rows() && m_matrix.cols() == other.cols());

  internal::triangular_assignment_selector
    <MatrixType, OtherDerived, int(Mode),
    unroll ? int(MatrixType::SizeAtCompileTime) : Dynamic,
    false // do not change the opposite triangular part
    >::run(m_matrix.const_cast_derived(), other.derived());
}